

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellBST.cpp
# Opt level: O2

void __thiscall chrono::fea::ChElementShellBST::~ChElementShellBST(ChElementShellBST *this)

{
  ~ChElementShellBST(this);
  Eigen::internal::handmade_aligned_free(this);
  return;
}

Assistant:

ChElementShellBST::~ChElementShellBST() {}